

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

void __thiscall
Omega_h::InputYamlReader::handle_block_scalar
          (InputYamlReader *this,size_t parent_indent_level,string *header,
          string *leading_empties_or_comments,string *rest,string *content,string *comment)

{
  pointer pcVar1;
  istream *piVar2;
  size_type sVar3;
  ulong uVar4;
  ParserFail *this_00;
  long lVar5;
  size_t sVar6;
  char chomping_indicator;
  char local_249;
  size_t indentation_indicator;
  string msg;
  string local_220;
  string newline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  
  indentation_indicator = 0;
  local_249 = *(header->_M_dataplus)._M_p;
  std::__cxx11::string::substr((ulong)&newline,(ulong)header);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&newline,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&newline);
  if ((1 < header->_M_string_length) && ((byte)(header->_M_dataplus)._M_p[1] - 0x30 < 10)) {
    std::istream::_M_extract<unsigned_long>((ulong *)&ss);
    indentation_indicator = indentation_indicator + parent_indent_level;
  }
  piVar2 = std::operator>>((istream *)&ss,&chomping_indicator);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    chomping_indicator = '\0';
  }
  std::__cxx11::string::find_first_of((char *)leading_empties_or_comments,0x37ea08);
  newline._M_dataplus._M_p = (pointer)&newline.field_2;
  newline._M_string_length = 0;
  newline.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&newline);
  if (*(leading_empties_or_comments->_M_dataplus)._M_p == '#') {
    std::__cxx11::string::substr((ulong)&msg,(ulong)leading_empties_or_comments);
    std::__cxx11::string::operator=((string *)comment,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  sVar3 = std::__cxx11::string::find_first_not_of((char *)leading_empties_or_comments,0x37ea0b);
  if (sVar3 == 0xffffffffffffffff) {
    sVar3 = leading_empties_or_comments->_M_string_length;
  }
  uVar4 = std::__cxx11::string::rfind((char *)leading_empties_or_comments,0x37d4b6);
  uVar4 = ~uVar4 + sVar3;
  sVar6 = uVar4;
  if ((indentation_indicator != 0) && (sVar6 = indentation_indicator, uVar4 < indentation_indicator)
     ) {
    std::__cxx11::string::string((string *)&msg,"Indentation indicator ",(allocator *)&local_220);
    std::__cxx11::to_string(&local_220,indentation_indicator);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::to_string(&local_220,uVar4);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::append((char *)&msg);
    this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
    ParserFail::ParserFail(this_00,&msg);
    __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::substr((ulong)&msg,(ulong)leading_empties_or_comments);
  std::__cxx11::string::operator=((string *)content,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::append((string *)content);
  while (lVar5 = std::__cxx11::string::find_last_of((char *)content,0x37d4b6), lVar5 != -1) {
    pcVar1 = (content->_M_dataplus)._M_p;
    for (uVar4 = 0;
        (lVar5 + 1 + uVar4 < content->_M_string_length && (pcVar1[uVar4 + lVar5 + 1] == ' '));
        uVar4 = uVar4 + 1) {
    }
    if (sVar6 <= uVar4) break;
    std::__cxx11::string::erase(content,pcVar1 + lVar5 + 1,pcVar1 + content->_M_string_length);
  }
  while (uVar4 = std::__cxx11::string::find_first_of((char *)content,0x37d4b6),
        uVar4 != 0xffffffffffffffff) {
    do {
      uVar4 = uVar4 + 1;
      if (content->_M_string_length <= uVar4) break;
    } while ((content->_M_dataplus)._M_p[uVar4] == ' ');
    std::__cxx11::string::substr((ulong)&local_220,(ulong)content);
    std::__cxx11::string::substr((ulong)&local_1d8,(ulong)content);
    std::operator+(&msg,&local_220,&local_1d8);
    std::__cxx11::string::operator=((string *)content,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
  }
  if (chomping_indicator != '+') {
    sVar3 = content->_M_string_length;
    do {
      if ((sVar3 == 0) ||
         (uVar4 = (ulong)(byte)(content->_M_dataplus)._M_p[sVar3 - 1], 0x20 < uVar4)) break;
      sVar3 = sVar3 - 1;
    } while ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0);
    std::__cxx11::string::substr((ulong)&msg,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (chomping_indicator != '-') {
      std::__cxx11::string::append((string *)content);
    }
  }
  if (local_249 == '|') {
    std::__cxx11::string::substr((ulong)&msg,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::~string((string *)&newline);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void handle_block_scalar(std::size_t parent_indent_level,
      std::string const& header, std::string const& leading_empties_or_comments,
      std::string const& rest, std::string& content, std::string& comment) {
    /* read the header, resulting in: block style, chomping indicator, and
     * indentation indicator */
    char style;
    char chomping_indicator;
    std::size_t indentation_indicator = 0;
    style = header[0];
    std::stringstream ss(header.substr(1, std::string::npos));
    if (header.size() > 1 && my_isdigit(header[1])) {
      ss >> indentation_indicator;
      // indentation indicator is given as a relative number, but we need it in
      // absolute terms
      indentation_indicator += parent_indent_level;
    }
    if (!(ss >> chomping_indicator)) chomping_indicator = '\0';
    /* get information about newlines, indentation level, and comment from
       the leading_empties_or_comments string */
    std::size_t first_newline =
        leading_empties_or_comments.find_first_of("\r\n");
    std::string newline;
    if (first_newline > 0 &&
        leading_empties_or_comments[first_newline - 1] == '\r') {
      newline = "\r\n";
    } else {
      newline = "\n";
    }
    std::size_t keep_beg = first_newline + 1 - newline.size();
    if (leading_empties_or_comments[0] == '#') {
      comment = leading_empties_or_comments.substr(1, keep_beg);
    }
    // according to the YAML spec, a tab is content, not indentation
    std::size_t content_beg =
        leading_empties_or_comments.find_first_not_of("\r\n ");
    if (content_beg == std::string::npos)
      content_beg = leading_empties_or_comments.size();
    std::size_t newline_before_content =
        leading_empties_or_comments.rfind("\n", content_beg);
    std::size_t num_indent_spaces = (content_beg - newline_before_content) - 1;
    /* indentation indicator overrides the derived level of indentation, in case
       the
       user wants to keep some of that indentation as content */
    if (indentation_indicator > 0) {
      if (num_indent_spaces < indentation_indicator) {
        std::string msg = "Indentation indicator ";
        msg += std::to_string(indentation_indicator);
        msg += " > leading spaces ";
        msg += std::to_string(num_indent_spaces);
        msg += "\n";
        throw ParserFail(msg);
      }
      num_indent_spaces = indentation_indicator;
    }
    /* prepend the content from the leading_empties_or_comments to the rest */
    content = leading_empties_or_comments.substr(keep_beg, std::string::npos);
    content += rest;
    /* per Trilinos issue #2090, there can be trailing comments after the block
       scalar which are less indented than it, but they will be included in the
       final NEWLINE token.
       this code removes all contiguous trailing lines which are less indented
       than the content.
     */
    while (true) {
      auto last_newline = content.find_last_of("\n", content.size() - 2);
      if (last_newline == std::string::npos) break;
      std::size_t num_spaces = 0;
      for (auto ispace = last_newline + 1;
           ispace < content.size() && content[ispace] == ' '; ++ispace) {
        ++num_spaces;
      }
      if (num_spaces >= num_indent_spaces) break;
      content.erase(content.begin() + long(last_newline + 1), content.end());
    }
    /* remove both indentation and newlines as dictated by header information */
    std::size_t unindent_pos = 0;
    while (true) {
      std::size_t next_newline = content.find_first_of("\n", unindent_pos);
      if (next_newline == std::string::npos) break;
      std::size_t start_cut = next_newline + 1;
      /* folding block scalars remove newlines */
      if (style == '>') start_cut -= newline.size();
      std::size_t end_cut = next_newline + 1;
      /* the actual amount of indentation in the content varies, start by
         marking it all for removal */
      while (end_cut < content.size() && content[end_cut] == ' ') {
        ++end_cut;
      }
      /* but don't remove more than the actual indent number */
      end_cut = std::min(next_newline + 1 + num_indent_spaces, end_cut);
      /* cut this (newline?)+indentation out of the content */
      content = content.substr(0, start_cut) +
                content.substr(end_cut, std::string::npos);
      unindent_pos = start_cut;
    }
    if (chomping_indicator != '+') {
      content = remove_trailing_whitespace_and_newlines(content);
      if (chomping_indicator != '-') content += newline;
    }
    if (style == '|') {
      // if not already, remove the leading newline
      content = content.substr(newline.size(), std::string::npos);
    }
  }